

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::~Array
          (Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this)

{
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar1;
  size_t sVar2;
  
  pMVar1 = this->ptr;
  if (pMVar1 != (Maybe<kj::Own<capnp::ClientHook>_> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    this->size_ = 0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pMVar1,0x10,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>::destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }